

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImGuiStb::stb_textedit_discard_undo(StbUndoState *state)

{
  int iVar1;
  void *in_RDI;
  int i;
  int n;
  int local_10;
  
  if (0 < *(short *)((long)in_RDI + 0xdfe)) {
    if (-1 < *(int *)((long)in_RDI + 0xc)) {
      iVar1 = *(int *)((long)in_RDI + 4);
      *(int *)((long)in_RDI + 0xe04) = *(int *)((long)in_RDI + 0xe04) - iVar1;
      memmove((void *)((long)in_RDI + 0x630),(void *)((long)in_RDI + (long)iVar1 * 2 + 0x630),
              (long)*(int *)((long)in_RDI + 0xe04) << 1);
      for (local_10 = 0; local_10 < *(short *)((long)in_RDI + 0xdfe); local_10 = local_10 + 1) {
        if (-1 < *(int *)((long)in_RDI + (long)local_10 * 0x10 + 0xc)) {
          *(int *)((long)in_RDI + (long)local_10 * 0x10 + 0xc) =
               *(int *)((long)in_RDI + (long)local_10 * 0x10 + 0xc) - iVar1;
        }
      }
    }
    *(short *)((long)in_RDI + 0xdfe) = *(short *)((long)in_RDI + 0xdfe) + -1;
    memmove(in_RDI,(void *)((long)in_RDI + 0x10),(long)*(short *)((long)in_RDI + 0xdfe) << 4);
  }
  return;
}

Assistant:

static void stb_textedit_discard_undo(StbUndoState *state)
{
   if (state->undo_point > 0) {
      // if the 0th undo state has characters, clean those up
      if (state->undo_rec[0].char_storage >= 0) {
         int n = state->undo_rec[0].insert_length, i;
         // delete n characters from all other records
         state->undo_char_point -= n;
         STB_TEXTEDIT_memmove(state->undo_char, state->undo_char + n, (size_t) (state->undo_char_point*sizeof(STB_TEXTEDIT_CHARTYPE)));
         for (i=0; i < state->undo_point; ++i)
            if (state->undo_rec[i].char_storage >= 0)
               state->undo_rec[i].char_storage -= n; // @OPTIMIZE: get rid of char_storage and infer it
      }
      --state->undo_point;
      STB_TEXTEDIT_memmove(state->undo_rec, state->undo_rec+1, (size_t) (state->undo_point*sizeof(state->undo_rec[0])));
   }
}